

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg2png.cpp
# Opt level: O0

bool setup(int argc,char **argv,string *filename,uint32_t *width,uint32_t *height,uint32_t *bgColor)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  istream *this;
  stringstream local_358 [8];
  stringstream ss_1;
  ostream local_348 [376];
  int local_1d0;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0 [376];
  uint32_t *local_38;
  uint32_t *bgColor_local;
  uint32_t *height_local;
  uint32_t *width_local;
  string *filename_local;
  char **argv_local;
  int argc_local;
  
  local_38 = bgColor;
  bgColor_local = height;
  height_local = width;
  width_local = (uint32_t *)filename;
  filename_local = (string *)argv;
  argv_local._0_4_ = argc;
  if (1 < argc) {
    std::__cxx11::string::assign((char *)filename);
  }
  if (2 < (int)argv_local) {
    std::__cxx11::stringstream::stringstream(local_1c0);
    std::operator<<(local_1b0,(char *)(filename_local->field_2)._M_allocated_capacity);
    std::istream::operator>>((istream *)local_1c0,height_local);
    bVar1 = std::ios::fail();
    if (((bVar1 & 1) == 0) && (iVar2 = std::istream::get(), iVar2 == 0x78)) {
      std::istream::operator>>((istream *)local_1c0,bgColor_local);
      local_1d0 = 0;
    }
    else {
      argv_local._7_1_ = 0;
      local_1d0 = 1;
    }
    std::__cxx11::stringstream::~stringstream(local_1c0);
    if (local_1d0 != 0) goto LAB_0010bb50;
  }
  if (3 < (int)argv_local) {
    std::__cxx11::stringstream::stringstream(local_358);
    poVar3 = (ostream *)std::ostream::operator<<(local_348,std::hex);
    std::operator<<(poVar3,*(char **)((long)&filename_local->field_2 + 8));
    this = (istream *)std::istream::operator>>((istream *)local_358,std::hex);
    std::istream::operator>>(this,local_38);
    std::__cxx11::stringstream::~stringstream(local_358);
  }
  argv_local._7_1_ = 1 < (int)argv_local;
LAB_0010bb50:
  return (bool)(argv_local._7_1_ & 1);
}

Assistant:

bool setup(int argc, char** argv, std::string& filename, std::uint32_t& width, std::uint32_t& height, std::uint32_t& bgColor)
{
    if(argc > 1) filename.assign(argv[1]);
    if(argc > 2) {
        std::stringstream ss;
        ss << argv[2];
        ss >> width;

        if(ss.fail() || ss.get() != 'x')
            return false;
        ss >> height;
    }

    if(argc > 3) {
        std::stringstream ss;
        ss << std::hex << argv[3];
        ss >> std::hex >> bgColor;
    }

    return argc > 1;
}